

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passpredict.cc
# Opt level: O1

double FindMaxElevation(CoordGeodetic *user_geo,SGP4 *sgp4,DateTime *aos,DateTime *los)

{
  long lVar1;
  DateTime DVar2;
  int64_t ticks;
  bool bVar3;
  double dVar4;
  CoordTopocentric topo;
  Observer obs;
  Eci eci;
  DateTime local_110;
  double local_108;
  double local_100;
  CoordTopocentric local_f8;
  Observer local_d8;
  Eci local_78;
  
  libsgp4::Observer::Observer(&local_d8,user_geo);
  local_100 = ((double)(los->m_encoded - aos->m_encoded) / 1000000.0) / 9.0;
  DVar2.m_encoded = los->m_encoded;
  local_110.m_encoded = aos->m_encoded;
  do {
    local_108 = -99999999999999.0;
    if (local_110.m_encoded < DVar2.m_encoded) {
      dVar4 = local_100 * 1000000.0;
      bVar3 = true;
      local_108 = -99999999999999.0;
      do {
        libsgp4::SGP4::FindPosition(&local_78,sgp4,&local_110);
        libsgp4::Observer::GetLookAngle(&local_f8,&local_d8,&local_78);
        if (local_f8.elevation <= local_108) {
          bVar3 = false;
        }
        else {
          local_110.m_encoded = local_110.m_encoded + (long)dVar4;
          if (DVar2.m_encoded <= local_110.m_encoded) {
            local_110.m_encoded = DVar2.m_encoded;
          }
          local_108 = local_f8.elevation;
        }
      } while ((bVar3) && (local_110.m_encoded < DVar2.m_encoded));
    }
    lVar1 = (long)(local_100 * -2.0 * 1000000.0);
    local_100 = ((double)-lVar1 / 1000000.0) / 9.0;
    DVar2.m_encoded = local_110.m_encoded;
    local_110.m_encoded = lVar1 + local_110.m_encoded;
  } while (1.0 < local_100);
  return local_108;
}

Assistant:

double FindMaxElevation(
        const libsgp4::CoordGeodetic& user_geo,
        libsgp4::SGP4& sgp4,
        const libsgp4::DateTime& aos,
        const libsgp4::DateTime& los)
{
    libsgp4::Observer obs(user_geo);

    bool running;

    double time_step = (los - aos).TotalSeconds() / 9.0;
    libsgp4::DateTime current_time(aos); //! current time
    libsgp4::DateTime time1(aos); //! start time of search period
    libsgp4::DateTime time2(los); //! end time of search period
    double max_elevation; //! max elevation

    running = true;

    do
    {
        running = true;
        max_elevation = -99999999999999.0;
        while (running && current_time < time2)
        {
            /*
             * find position
             */
            libsgp4::Eci eci = sgp4.FindPosition(current_time);
            libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);

            if (topo.elevation > max_elevation)
            {
                /*
                 * still going up
                 */
                max_elevation = topo.elevation;
                /*
                 * move time along
                 */
                current_time = current_time.AddSeconds(time_step);
                if (current_time > time2)
                {
                    /*
                     * dont go past end time
                     */
                    current_time = time2;
                }
            }
            else
            {
                /*
                 * stop
                 */
                running = false;
            }
        }

        /*
         * make start time to 2 time steps back
         */
        time1 = current_time.AddSeconds(-2.0 * time_step);
        /*
         * make end time to current time
         */
        time2 = current_time;
        /*
         * current time to start time
         */
        current_time = time1;
        /*
         * recalculate time step
         */
        time_step = (time2 - time1).TotalSeconds() / 9.0;
    }
    while (time_step > 1.0);

    return max_elevation;
}